

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySet.h
# Opt level: O2

void __thiscall
cmInstallRuntimeDependencySet::AddModule
          (cmInstallRuntimeDependencySet *this,cmInstallImportedRuntimeArtifactsGenerator *module)

{
  pointer *__ptr;
  _Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false> local_28;
  _Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false> local_20;
  cmInstallImportedRuntimeArtifactsGenerator *local_18;
  
  local_18 = module;
  std::
  make_unique<cmInstallRuntimeDependencySet::ImportedTargetItem,cmInstallImportedRuntimeArtifactsGenerator*&>
            ((cmInstallImportedRuntimeArtifactsGenerator **)&local_20);
  local_28._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (Item *)0x0;
  AddModule(this,(unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
                  *)&local_28);
  if (local_28._M_head_impl != (Item *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Item[1])();
  }
  local_28._M_head_impl = (Item *)0x0;
  if (local_20._M_head_impl != (Item *)0x0) {
    (*(local_20._M_head_impl)->_vptr_Item[1])();
  }
  return;
}

Assistant:

void AddModule(cmInstallImportedRuntimeArtifactsGenerator* module)
  {
    this->AddModule(cm::make_unique<ImportedTargetItem>(module));
  }